

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

void __thiscall libcellml::Logger::LoggerImpl::removeError(LoggerImpl *this,size_t index)

{
  reference pvVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_50;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_48;
  const_iterator local_40;
  shared_ptr<libcellml::Issue> *local_38;
  __normal_iterator<std::shared_ptr<libcellml::Issue>_*,_std::vector<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>_>
  local_30;
  __normal_iterator<std::shared_ptr<libcellml::Issue>_*,_std::vector<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>_>
  local_28;
  const_iterator local_20;
  size_type local_18;
  size_t index_local;
  LoggerImpl *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  local_30._M_current =
       (shared_ptr<libcellml::Issue> *)
       std::
       vector<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
       ::begin(&this->mIssues);
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(&this->mErrors,local_18);
  local_28 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<libcellml::Issue>_*,_std::vector<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>_>
             ::operator+(&local_30,*pvVar1);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<libcellml::Issue>const*,std::vector<std::shared_ptr<libcellml::Issue>,std::allocator<std::shared_ptr<libcellml::Issue>>>>
  ::__normal_iterator<std::shared_ptr<libcellml::Issue>*>
            ((__normal_iterator<std::shared_ptr<libcellml::Issue>const*,std::vector<std::shared_ptr<libcellml::Issue>,std::allocator<std::shared_ptr<libcellml::Issue>>>>
              *)&local_20,&local_28);
  local_38 = (shared_ptr<libcellml::Issue> *)
             std::
             vector<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
             ::erase(&this->mIssues,local_20);
  local_50._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->mErrors);
  local_48 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator+(&local_50,local_18);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
              *)&local_40,&local_48);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase(&this->mErrors,local_40);
  return;
}

Assistant:

void Logger::LoggerImpl::removeError(size_t index)
{
    mIssues.erase(mIssues.begin() + ptrdiff_t(mErrors.at(index)));
    mErrors.erase(mErrors.begin() + ptrdiff_t(index));
}